

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2dense.c
# Opt level: O3

void mod2dense_set(mod2dense *m,int row,int col,int value)

{
  mod2word **ppmVar1;
  mod2word *pmVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  int extraout_EDX;
  long extraout_RDX;
  int iVar6;
  undefined4 in_register_00000034;
  mod2dense *m_00;
  uint uVar7;
  int col_00;
  
  m_00 = (mod2dense *)CONCAT44(in_register_00000034,row);
  if ((((-1 < row) && (-1 < col)) && (row < m->n_rows)) && (col < m->n_cols)) {
    uVar3 = m->col[(uint)col][(uint)row >> 5];
    uVar7 = uVar3 & ~(1 << (row & 0x1fU));
    if (value != 0) {
      uVar7 = uVar3 | 1 << (row & 0x1fU);
    }
    m->col[(uint)col][(uint)row >> 5] = uVar7;
    return;
  }
  mod2dense_set_cold_1();
  if (((-1 < (int)m_00) && (-1 < extraout_EDX)) &&
     (((int)m_00 < ((FILE *)m)->_flags && (extraout_EDX < *(int *)&((FILE *)m)->field_0x4)))) {
    return;
  }
  mod2dense_get_cold_1();
  if (m_00->n_rows < ((FILE *)m)->_flags) {
LAB_00122e20:
    mod2dense_copycols_cold_2();
    if (0 < m_00->n_rows) {
      iVar6 = 0;
      do {
        if (0 < m_00->n_cols) {
          col_00 = 0;
          do {
            uVar3 = mod2dense_get(m_00,iVar6,col_00);
            fprintf((FILE *)m," %d",(ulong)uVar3);
            col_00 = col_00 + 1;
          } while (col_00 < m_00->n_cols);
        }
        fputc(10,(FILE *)m);
        iVar6 = iVar6 + 1;
      } while (iVar6 < m_00->n_rows);
    }
    return;
  }
  if (0 < m_00->n_cols) {
    lVar4 = 0;
    do {
      iVar6 = *(int *)(extraout_RDX + lVar4 * 4);
      if ((iVar6 < 0) || (*(int *)&((FILE *)m)->field_0x4 <= iVar6)) {
        mod2dense_copycols_cold_1();
        goto LAB_00122e20;
      }
      if (*(int *)&((FILE *)m)->_IO_read_ptr < 1) {
        uVar5 = 0;
      }
      else {
        ppmVar1 = (mod2word **)((FILE *)m)->_IO_read_end;
        pmVar2 = m_00->col[lVar4];
        uVar5 = 0;
        do {
          pmVar2[uVar5] = ppmVar1[*(int *)(extraout_RDX + lVar4 * 4)][uVar5];
          uVar5 = uVar5 + 1;
        } while ((long)uVar5 < (long)*(int *)&((FILE *)m)->_IO_read_ptr);
      }
      if ((int)uVar5 < m_00->n_words) {
        pmVar2 = m_00->col[lVar4];
        uVar5 = uVar5 & 0xffffffff;
        do {
          pmVar2[uVar5] = 0;
          uVar5 = uVar5 + 1;
        } while ((int)uVar5 < m_00->n_words);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < m_00->n_cols);
  }
  return;
}

Assistant:

void mod2dense_set 
( mod2dense *m, 	/* Matrix to modify element of */
  int row,		/* Row of element (starting with zero) */
  int col,		/* Column of element (starting with zero) */
  int value		/* New value of element (0 or 1) */
)
{ 
  mod2word *w;

  if (row<0 || row>=mod2dense_rows(m) || col<0 || col>=mod2dense_cols(m))
  { fprintf(stderr,"mod2dense_set: row or column index out of bounds\n");
    exit(1);
  }

  w = &m->col[col][row>>mod2_wordsize_shift];

  *w = value ? mod2_setbit1(*w,row&mod2_wordsize_mask) 
             : mod2_setbit0(*w,row&mod2_wordsize_mask);
}